

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

SHWBufferLink * __thiscall irr::video::CNullDriver::getBufferLink(CNullDriver *this,IMeshBuffer *mb)

{
  ulong uVar1;
  long *in_RSI;
  long *in_RDI;
  SHWBufferLink *HWBuffer;
  SHWBufferLink *local_8;
  
  if ((in_RSI == (long *)0x0) ||
     (uVar1 = (**(code **)(*in_RDI + 0x380))(in_RDI,in_RSI), (uVar1 & 1) == 0)) {
    local_8 = (SHWBufferLink *)0x0;
  }
  else {
    local_8 = (SHWBufferLink *)(**(code **)(*in_RSI + 0xd8))();
    if (local_8 == (SHWBufferLink *)0x0) {
      local_8 = (SHWBufferLink *)(**(code **)(*in_RDI + 0x370))(in_RDI,in_RSI);
    }
  }
  return local_8;
}

Assistant:

CNullDriver::SHWBufferLink *CNullDriver::getBufferLink(const scene::IMeshBuffer *mb)
{
	if (!mb || !isHardwareBufferRecommend(mb))
		return 0;

	// search for hardware links
	SHWBufferLink *HWBuffer = reinterpret_cast<SHWBufferLink *>(mb->getHWBuffer());
	if (HWBuffer)
		return HWBuffer;

	return createHardwareBuffer(mb); // no hardware links, and mesh wants one, create it
}